

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O0

int ApplyCrossColorFilter
              (VP8LEncoder *enc,int width,int height,int quality,int low_effort,VP8LBitWriter *bw,
              int percent_range,int *percent)

{
  int iVar1;
  uint32_t in_EDX;
  uint32_t in_ESI;
  long in_RDI;
  int iVar2;
  int in_stack_00000008;
  int best_bits;
  int min_bits;
  WebPPicture *in_stack_000000c0;
  int in_stack_000000c8;
  int *in_stack_000000d0;
  uint32_t *in_stack_000007d8;
  uint32_t *in_stack_000007e0;
  int in_stack_000007ec;
  int in_stack_000007f0;
  int in_stack_000007f4;
  int in_stack_000007f8;
  WebPPicture *in_stack_00000810;
  int in_stack_00000818;
  int *in_stack_00000820;
  int *in_stack_00000828;
  undefined8 uVar3;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 local_48;
  undefined4 local_1c;
  
  uVar3 = *(undefined8 *)(in_RDI + 8);
  iVar2 = in_stack_00000008 / 2;
  iVar1 = VP8LColorSpaceTransform
                    (in_stack_000007f8,in_stack_000007f4,in_stack_000007f0,in_stack_000007ec,
                     in_stack_000007e0,in_stack_000007d8,in_stack_00000810,in_stack_00000818,
                     in_stack_00000820,in_stack_00000828);
  if (iVar1 == 0) {
    local_1c = 0;
  }
  else {
    VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff64,iVar2),
                (uint32_t)((ulong)uVar3 >> 0x20),(int)uVar3);
    VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff64,iVar2),
                (uint32_t)((ulong)uVar3 >> 0x20),(int)uVar3);
    VP8LPutBits((VP8LBitWriter *)CONCAT44(in_stack_ffffffffffffff64,iVar2),
                (uint32_t)((ulong)uVar3 >> 0x20),(int)uVar3);
    *(uint32_t *)(in_RDI + 0x4c) = local_48;
    VP8LSubSampleSize(in_ESI,local_48);
    VP8LSubSampleSize(in_EDX,local_48);
    local_1c = EncodeImageNoHuffman
                         ((VP8LBitWriter *)enc,(uint32_t *)CONCAT44(width,height),
                          (VP8LHashChain *)CONCAT44(quality,low_effort),(VP8LBackwardRefs *)bw,
                          min_bits,best_bits,percent_range,(int)percent,in_stack_000000c0,
                          in_stack_000000c8,in_stack_000000d0);
  }
  return local_1c;
}

Assistant:

static int ApplyCrossColorFilter(VP8LEncoder* const enc, int width, int height,
                                 int quality, int low_effort,
                                 VP8LBitWriter* const bw, int percent_range,
                                 int* const percent) {
  const int min_bits = enc->cross_color_transform_bits;
  int best_bits;

  if (!VP8LColorSpaceTransform(width, height, min_bits, quality, enc->argb,
                               enc->transform_data, enc->pic,
                               percent_range / 2, percent, &best_bits)) {
    return 0;
  }
  VP8LPutBits(bw, TRANSFORM_PRESENT, 1);
  VP8LPutBits(bw, CROSS_COLOR_TRANSFORM, 2);
  assert(best_bits >= MIN_TRANSFORM_BITS && best_bits <= MAX_TRANSFORM_BITS);
  VP8LPutBits(bw, best_bits - MIN_TRANSFORM_BITS, NUM_TRANSFORM_BITS);
  enc->cross_color_transform_bits = best_bits;
  return EncodeImageNoHuffman(
      bw, enc->transform_data, &enc->hash_chain, &enc->refs[0],
      VP8LSubSampleSize(width, best_bits), VP8LSubSampleSize(height, best_bits),
      quality, low_effort, enc->pic, percent_range - percent_range / 2,
      percent);
}